

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O2

int run_test_delayed_accept(void)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStack_20;
  sockaddr_in addr;
  
  pvVar2 = malloc(0xf8);
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    if (pvVar2 == (void *)0x0) {
      pcVar4 = "server != NULL";
      uStack_20 = 0x6a;
    }
    else {
      uVar3 = uv_default_loop();
      iVar1 = uv_tcp_init(uVar3,pvVar2);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_bind(pvVar2,&addr,0);
        if (iVar1 == 0) {
          iVar1 = uv_listen(pvVar2,0x80,connection_cb);
          if (iVar1 == 0) {
            client_connect();
            client_connect();
            uVar3 = uv_default_loop();
            uv_run(uVar3,0);
            if (connection_cb_called == 2) {
              if (do_accept_called == 2) {
                if (connect_cb_called == 2) {
                  if (close_cb_called == 7) {
                    uVar3 = uv_default_loop();
                    uv_walk(uVar3,close_walk_cb,0);
                    uv_run(uVar3,0);
                    uVar3 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar3);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                    uStack_20 = 0xbb;
                  }
                  else {
                    pcVar4 = "close_cb_called == 7";
                    uStack_20 = 0xb9;
                  }
                }
                else {
                  pcVar4 = "connect_cb_called == 2";
                  uStack_20 = 0xb8;
                }
              }
              else {
                pcVar4 = "do_accept_called == 2";
                uStack_20 = 0xb7;
              }
            }
            else {
              pcVar4 = "connection_cb_called == 2";
              uStack_20 = 0xb6;
            }
          }
          else {
            pcVar4 = "r == 0";
            uStack_20 = 0x72;
          }
        }
        else {
          pcVar4 = "r == 0";
          uStack_20 = 0x6f;
        }
      }
      else {
        pcVar4 = "r == 0";
        uStack_20 = 0x6d;
      }
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_20 = 0x69;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-delayed-accept.c"
          ,uStack_20,pcVar4);
  abort();
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;
  uv_tcp_t* server = (uv_tcp_t*)malloc(sizeof *server);
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  ASSERT(server != NULL);

  r = uv_tcp_init(uv_default_loop(), server);
  ASSERT(r == 0);
  r = uv_tcp_bind(server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)server, 128, connection_cb);
  ASSERT(r == 0);
}